

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_COMMAND_AUDIT_INFO_Unmarshal(TPMS_COMMAND_AUDIT_INFO *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  BYTE *pBVar2;
  UINT16 UVar3;
  TPM_RC TVar4;
  UINT64 UVar5;
  
  iVar1 = *size;
  *size = iVar1 + -8;
  TVar4 = 0x9a;
  if (7 < iVar1) {
    UVar5 = ByteArrayToUint64(*buffer);
    target->auditCounter = UVar5;
    pBVar2 = *buffer;
    *buffer = pBVar2 + 8;
    iVar1 = *size;
    *size = iVar1 + -2;
    if (1 < iVar1) {
      UVar3 = ByteArrayToUint16(pBVar2 + 8);
      target->digestAlg = UVar3;
      *buffer = *buffer + 2;
      TVar4 = TPM2B_DIGEST_Unmarshal(&target->auditDigest,buffer,size);
      if (TVar4 == 0) {
        TVar4 = TPM2B_DIGEST_Unmarshal(&target->commandDigest,buffer,size);
        return TVar4;
      }
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
UINT64_Unmarshal(UINT64 *target, BYTE **buffer, INT32 *size)
{
    if((*size -= 8) < 0)
        return TPM_RC_INSUFFICIENT;
    *target = BYTE_ARRAY_TO_UINT64(*buffer);
    *buffer += 8;
    return TPM_RC_SUCCESS;
}